

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMPPacket.cpp
# Opt level: O3

shared_ptr<ComplexType> __thiscall SNMPPacket::generateVarBindList(SNMPPacket *this)

{
  long lVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  shared_ptr<BER_CONTAINER> *newObj;
  undefined8 *puVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  long lVar4;
  long in_RSI;
  long lVar5;
  long lVar6;
  shared_ptr<ComplexType> sVar7;
  undefined1 local_60 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  puVar2 = (undefined8 *)operator_new(0x38);
  puVar2[1] = 0x100000001;
  *puVar2 = &PTR___Sp_counted_ptr_inplace_001a1810;
  puVar2[3] = 0x30;
  puVar2[2] = &PTR__ComplexType_001a1058;
  puVar2[4] = 0;
  puVar2[5] = 0;
  puVar2[6] = 0;
  *(undefined8 **)&this->reuse = puVar2;
  this->_vptr_SNMPPacket = (_func_int **)(puVar2 + 2);
  lVar4 = *(long *)(in_RSI + 0x88);
  lVar1 = *(long *)(in_RSI + 0xa8);
  _Var3._M_pi = extraout_RDX;
  if (lVar4 != lVar1) {
    lVar5 = *(long *)(in_RSI + 0x98);
    lVar6 = *(long *)(in_RSI + 0xa0);
    do {
      this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
      this_01->_M_use_count = 1;
      this_01->_M_weak_count = 1;
      this_01->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001a1810;
      this_01[1]._M_use_count = 0x30;
      this_01[1]._M_weak_count = 0;
      this_01[1]._vptr__Sp_counted_base = (_func_int **)&PTR__ComplexType_001a1058;
      this_01[2]._vptr__Sp_counted_base = (_func_int **)0x0;
      this_01[2]._M_use_count = 0;
      this_01[2]._M_weak_count = 0;
      this_01[3]._vptr__Sp_counted_base = (_func_int **)0x0;
      this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar4 + 8);
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      ComplexType::addValueToList
                ((ComplexType *)&stack0xffffffffffffffc0,(shared_ptr<BER_CONTAINER> *)(this_01 + 1))
      ;
      if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      ComplexType::addValueToList
                ((ComplexType *)(local_60 + 0x10),(shared_ptr<BER_CONTAINER> *)(this_01 + 1));
      if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
      }
      newObj = (shared_ptr<BER_CONTAINER> *)this->_vptr_SNMPPacket;
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_01->_M_use_count = this_01->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_01->_M_use_count = this_01->_M_use_count + 1;
      }
      ComplexType::addValueToList((ComplexType *)local_60,newObj);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_);
      }
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      }
      Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      lVar4 = lVar4 + 0x30;
      if (lVar4 == lVar5) {
        lVar4 = *(long *)(lVar6 + 8);
        lVar6 = lVar6 + 8;
        lVar5 = lVar4 + 0x1e0;
      }
      _Var3._M_pi = extraout_RDX_00;
    } while (lVar4 != lVar1);
  }
  sVar7.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi;
  sVar7.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<ComplexType>)sVar7.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ComplexType> SNMPPacket::generateVarBindList(){
    SNMP_LOGD("generateVarBindList from SNMPPacket");
    // This is for normal packets where our response values have already been built, not traps
    auto varBindList = std::make_shared<ComplexType>(STRUCTURE);

    for(const auto& varBindItem : varbindList){
        auto varBind = std::make_shared<ComplexType>(STRUCTURE);

        varBind->addValueToList(varBindItem.oid);
        varBind->addValueToList(varBindItem.value);

        varBindList->addValueToList(varBind);
    }

    return varBindList;
}